

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

int Kit_WordFindFirstBit(uint uWord)

{
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = 0;
      (uVar1 = 0xffffffff, uVar2 != 0x20 && (uVar1 = uVar2, (uWord >> (uVar2 & 0x1f) & 1) == 0));
      uVar2 = uVar2 + 1) {
  }
  return uVar1;
}

Assistant:

static inline int Kit_WordFindFirstBit( unsigned uWord )
{
    int i;
    for ( i = 0; i < 32; i++ )
        if ( uWord & (1 << i) )
            return i;
    return -1;
}